

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

U64 HUF_DEltX1_set4(BYTE symbol,BYTE nbBits)

{
  uint uVar1;
  int iVar2;
  ulong local_18;
  U64 D4;
  BYTE nbBits_local;
  BYTE symbol_local;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    iVar2 = (uint)symbol + (uint)nbBits * 0x100;
  }
  else {
    iVar2 = (uint)symbol * 0x100 + (uint)nbBits;
  }
  local_18 = (ulong)iVar2;
  if (local_18 < 0x10000) {
    return local_18 * 0x1000100010001;
  }
  __assert_fail("D4 < (1U << 16)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                ,0x13a,"U64 HUF_DEltX1_set4(BYTE, BYTE)");
}

Assistant:

static U64 HUF_DEltX1_set4(BYTE symbol, BYTE nbBits) {
    U64 D4;
    if (MEM_isLittleEndian()) {
        D4 = (U64)((symbol << 8) + nbBits);
    } else {
        D4 = (U64)(symbol + (nbBits << 8));
    }
    assert(D4 < (1U << 16));
    D4 *= 0x0001000100010001ULL;
    return D4;
}